

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirtyudp.h
# Opt level: O1

void __thiscall
UdpReceiver::Loop(UdpReceiver *this,_func_void_char_ptr_int_void_ptr *udpCallback,void *data)

{
  atomic<bool> *paVar1;
  __int_type_conflict1 _Var2;
  ushort uVar3;
  in_addr __in;
  in_addr_t iVar4;
  int iVar5;
  ssize_t sVar6;
  hostent *phVar7;
  char *pcVar8;
  void *pvVar9;
  undefined4 extraout_EDX;
  int extraout_EDX_00;
  char *pcVar10;
  in_addr *__addr;
  UdpSender *pUVar11;
  anon_class_8_1_8991fb9c_for_callback callback;
  anon_class_16_2_8a47e332_for_handler_ aStack_60;
  UdpSender *pUStack_50;
  UdpReceiver *pUStack_48;
  
  memset(this->buffer,0,(long)this->bufferSize);
  __addr = (in_addr *)(ulong)(uint)this->socketFile;
  pcVar10 = this->buffer;
  iVar5 = 0;
  sVar6 = recvfrom(this->socketFile,pcVar10,(long)this->bufferSize,0,
                   (sockaddr *)&this->clientAddress,&this->clientLength);
  if ((int)sVar6 < 0) {
    Loop();
  }
  else {
    __addr = &(this->clientAddress).sin_addr;
    pcVar10 = (char *)0x4;
    phVar7 = gethostbyaddr(__addr,4,2);
    this->client = (hostent *)phVar7;
    if (phVar7 != (hostent *)0x0) {
      __in.s_addr = (this->clientAddress).sin_addr.s_addr;
      __addr = (in_addr *)(ulong)__in.s_addr;
      pcVar8 = inet_ntoa(__in);
      this->clientIP = pcVar8;
      if (pcVar8 != (char *)0x0) {
        (*udpCallback)(this->buffer,(int)sVar6,data);
        return;
      }
      goto LAB_0014b0bc;
    }
  }
  Loop();
LAB_0014b0bc:
  Loop();
  __addr[0xe] = 1;
  *(char **)(__addr + 6) = pcVar10;
  __addr[1] = (in_addr)extraout_EDX;
  __addr[2] = (in_addr)iVar5;
  pvVar9 = calloc((long)iVar5,1);
  *(void **)(__addr + 4) = pvVar9;
  pUVar11 = (UdpSender *)0x2;
  iVar5 = 2;
  iVar4 = socket(2,2,0);
  __addr->s_addr = iVar4;
  if ((int)iVar4 < 0) {
    UdpSender::UdpSender(pUVar11);
  }
  else {
    phVar7 = gethostbyname(*(char **)(__addr + 6));
    *(hostent **)(__addr + 0xc) = phVar7;
    if (phVar7 != (hostent *)0x0) {
      *(undefined8 *)(__addr + 8) = 0;
      *(undefined8 *)(__addr + 10) = 0;
      *(undefined2 *)(__addr + 8) = 2;
      memmove(__addr + 9,*phVar7->h_addr_list,(long)phVar7->h_length);
      *(ushort *)((long)(__addr + 8) + 2) =
           *(ushort *)(__addr + 1) << 8 | *(ushort *)(__addr + 1) >> 8;
      return;
    }
  }
  pUVar11 = (UdpSender *)(__addr + 6);
  UdpSender::UdpSender(pUVar11);
  pUVar11->port = iVar5;
  pUVar11->bufferSize = extraout_EDX_00;
  pcVar10 = (char *)calloc((long)extraout_EDX_00,1);
  pUVar11->buffer = pcVar10;
  callback.this = (State *)0x2;
  iVar5 = socket(2,2,0);
  pUVar11->socketFile = iVar5;
  if (iVar5 < 0) {
    UdpReceiver((UdpReceiver *)callback.this);
  }
  else {
    *(undefined4 *)&pUVar11->field_0xc = 1;
    setsockopt(iVar5,1,2,&pUVar11->field_0xc,4);
    (pUVar11->serverAddress).sin_family = 0;
    (pUVar11->serverAddress).sin_port = 0;
    (pUVar11->serverAddress).sin_addr = 0;
    (pUVar11->serverAddress).sin_zero[0] = '\0';
    (pUVar11->serverAddress).sin_zero[1] = '\0';
    (pUVar11->serverAddress).sin_zero[2] = '\0';
    (pUVar11->serverAddress).sin_zero[3] = '\0';
    (pUVar11->serverAddress).sin_zero[4] = '\0';
    (pUVar11->serverAddress).sin_zero[5] = '\0';
    (pUVar11->serverAddress).sin_zero[6] = '\0';
    (pUVar11->serverAddress).sin_zero[7] = '\0';
    (pUVar11->serverAddress).sin_family = 2;
    (pUVar11->serverAddress).sin_addr.s_addr = 0;
    uVar3 = (ushort)pUVar11->port;
    (pUVar11->serverAddress).sin_port = uVar3 << 8 | uVar3 >> 8;
    callback.this = (State *)(ulong)(uint)pUVar11->socketFile;
    iVar5 = bind(pUVar11->socketFile,(sockaddr *)&pUVar11->serverAddress,0x10);
    if (-1 < iVar5) {
      pUVar11[1].bufferSize = 0x10;
      return;
    }
  }
  UdpReceiver((UdpReceiver *)callback.this);
  ((callback.this)->running)._M_base._M_i = true;
  pUStack_50 = pUVar11;
  pUStack_48 = this;
  ableton::Link::Link(&(callback.this)->link,120.0);
  (callback.this)->latency = 0.4;
  (callback.this)->beatOffset = 0;
  LOCK();
  paVar1 = &((callback.this)->link).mController.mEnabled;
  _Var2 = (paVar1->_M_base)._M_i;
  (paVar1->_M_base)._M_i = true;
  UNLOCK();
  if ((_Var2 & 1U) == 0) {
    aStack_60.this = &((callback.this)->link).mController;
    aStack_60.bEnable = true;
    asio::io_context::
    post<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::enable(bool)::_lambda()_1_>
              ((io_context *)
               ((callback.this)->link).mController.mIo.val.mpService._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>,&aStack_60);
  }
  ableton::Link::setTempoCallback<State::State()::_lambda(double)_1_>
            (&(callback.this)->link,callback);
  (callback.this)->quantum = 4.0;
  return;
}

Assistant:

void Loop(void (*udpCallback)(char* packet, int packetSize, void* data), void* data) {
      int packetSize;
      bzero(this->buffer, this->bufferSize*sizeof(char));
      packetSize = recvfrom(  this->socketFile,
                              this->buffer,
                              this->bufferSize,
                              0,
                              (struct sockaddr *)&this->clientAddress,
                              &this->clientLength);
      if(packetSize < 0)
        error("ERROR: There was a problem receiving data from a client");
      this->client = gethostbyaddr( (const char*)&this->clientAddress.sin_addr.s_addr,
                                    sizeof(this->clientAddress.sin_addr.s_addr),
                                    AF_INET);
      if(this->client == NULL)
        error("ERROR: Error getting client host info");
      this->clientIP = inet_ntoa(this->clientAddress.sin_addr);
      if(this->clientIP == NULL)
        error("ERROR: Error getting client IP.");
      // ----------------------------- //
      // --- Some old info logging --- //
      // ----------------------------- //
      /*
      printf("Received datagram from %s (%s):\n",
              this->client->h_name,
              this->clientIP);
      for(int i=0; i<strlen(this->buffer)&&i<this->bufferSize; i++)
        printf("%c", this->buffer[i]);
      printf("\n");
      */
      udpCallback(this->buffer, packetSize, data);
    }